

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_xonly_pubkey_parse
              (secp256k1_context *ctx,secp256k1_xonly_pubkey *pubkey,uchar *input32)

{
  int iVar1;
  long in_RDX;
  void *in_RSI;
  secp256k1_fe x;
  secp256k1_ge pk;
  secp256k1_ge *in_stack_ffffffffffffff58;
  secp256k1_callback *in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffffb4;
  secp256k1_fe *in_stack_ffffffffffffffb8;
  secp256k1_ge *in_stack_ffffffffffffffc0;
  undefined4 local_4;
  
  if (in_RSI == (void *)0x0) {
    secp256k1_callback_call(in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
    local_4 = 0;
  }
  else {
    memset(in_RSI,0,0x40);
    if (in_RDX == 0) {
      secp256k1_callback_call(in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
      local_4 = 0;
    }
    else {
      iVar1 = secp256k1_fe_impl_set_b32_limit
                        ((secp256k1_fe *)in_stack_ffffffffffffff60,
                         (uchar *)in_stack_ffffffffffffff58);
      if (iVar1 == 0) {
        local_4 = 0;
      }
      else {
        iVar1 = secp256k1_ge_set_xo_var
                          (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                           in_stack_ffffffffffffffb4);
        if (iVar1 == 0) {
          local_4 = 0;
        }
        else {
          iVar1 = secp256k1_ge_is_in_correct_subgroup((secp256k1_ge *)0x944154);
          if (iVar1 == 0) {
            local_4 = 0;
          }
          else {
            secp256k1_xonly_pubkey_save
                      ((secp256k1_xonly_pubkey *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58
                      );
            local_4 = 1;
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

int secp256k1_xonly_pubkey_parse(const secp256k1_context* ctx, secp256k1_xonly_pubkey *pubkey, const unsigned char *input32) {
    secp256k1_ge pk;
    secp256k1_fe x;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(pubkey != NULL);
    memset(pubkey, 0, sizeof(*pubkey));
    ARG_CHECK(input32 != NULL);

    if (!secp256k1_fe_set_b32_limit(&x, input32)) {
        return 0;
    }
    if (!secp256k1_ge_set_xo_var(&pk, &x, 0)) {
        return 0;
    }
    if (!secp256k1_ge_is_in_correct_subgroup(&pk)) {
        return 0;
    }
    secp256k1_xonly_pubkey_save(pubkey, &pk);
    return 1;
}